

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDrawTests.cpp
# Opt level: O1

int __thiscall deqp::gles2::Functional::DrawTests::init(DrawTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  Context *pCVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  DrawMethod method;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long lVar4;
  string desc;
  string name;
  string local_70;
  string local_50;
  
  lVar4 = 0;
  do {
    uVar1 = *(uint *)((long)Functional::anon_unknown_0::RandomGroup::init::drawMethods + lVar4);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              (&local_50,(DrawTestSpec *)(ulong)uVar1,(DrawMethod)in_RDX);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              (&local_70,(DrawTestSpec *)(ulong)uVar1,method);
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,pCVar2->m_testCtx,local_50._M_dataplus._M_p,
               local_70._M_dataplus._M_p);
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_0216db28;
    *(uint *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    in_RDX = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      in_RDX = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      in_RDX = extraout_RDX_01;
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 == 4);
  pTVar3 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar2->m_testCtx,"random","random draw commands.");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_0216dc68;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  return extraout_EAX;
}

Assistant:

void DrawTests::init (void)
{
	// Basic
	{
		const gls::DrawTestSpec::DrawMethod basicMethods[] =
		{
			gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(basicMethods); ++ndx)
		{
			std::string name = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);
			std::string desc = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);

			this->addChild(new MethodGroup(m_context, name.c_str(), desc.c_str(), basicMethods[ndx]));
		}
	}

	// Random

	this->addChild(new RandomGroup(m_context, "random", "random draw commands."));
}